

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrt_of_one_minus_x_squared.c
# Opt level: O3

void WebRtcSpl_SqrtOfOneMinusXSquared(int16_t *xQ15,size_t vector_length,int16_t *yQ15)

{
  int32_t iVar1;
  size_t sVar2;
  
  if (vector_length != 0) {
    sVar2 = 0;
    do {
      iVar1 = WebRtcSpl_Sqrt(0x3fffffff - (int)xQ15[sVar2] * (int)xQ15[sVar2]);
      yQ15[sVar2] = (int16_t)iVar1;
      sVar2 = sVar2 + 1;
    } while (vector_length != sVar2);
  }
  return;
}

Assistant:

void WebRtcSpl_SqrtOfOneMinusXSquared(int16_t *xQ15, size_t vector_length,
                                      int16_t *yQ15)
{
    int32_t sq;
    size_t m;
    int16_t tmp;

    for (m = 0; m < vector_length; m++)
    {
        tmp = xQ15[m];
        sq = tmp * tmp;  // x^2 in Q30
        sq = 1073741823 - sq; // 1-x^2, where 1 ~= 0.99999999906 is 1073741823 in Q30
        sq = WebRtcSpl_Sqrt(sq); // sqrt(1-x^2) in Q15
        yQ15[m] = (int16_t)sq;
    }
}